

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O1

wchar_t skip_base_block(archive_read *a)

{
  void *pvVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  archive_entry *entry;
  
  pvVar1 = a->format->data;
  entry = archive_entry_new();
  wVar2 = process_base_block(a,entry);
  archive_entry_free(entry);
  wVar3 = L'\xffffffe2';
  if ((wVar2 != L'\xffffffe2') &&
     (((*(int *)((long)pvVar1 + 0x28) != 2 ||
       (wVar3 = L'\0', (*(byte *)((long)pvVar1 + 0x20) & 2) == 0)) &&
      (wVar3 = L'\xfffffff6', wVar2 != L'\0')))) {
    wVar3 = wVar2;
  }
  return wVar3;
}

Assistant:

static int skip_base_block(struct archive_read* a) {
	int ret;
	struct rar5* rar = get_context(a);

	/* Create a new local archive_entry structure that will be operated on
	 * by header reader; operations on this archive_entry will be discarded.
	 */
	struct archive_entry* entry = archive_entry_new();
	ret = process_base_block(a, entry);

	/* Discard operations on this archive_entry structure. */
	archive_entry_free(entry);
	if(ret == ARCHIVE_FATAL)
		return ret;

	if(rar->generic.last_header_id == 2 && rar->generic.split_before > 0)
		return ARCHIVE_OK;

	if(ret == ARCHIVE_OK)
		return ARCHIVE_RETRY;
	else
		return ret;
}